

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::resize_bilinear_font(uchar *font_bitmap,uchar *resized_font_bitmap,int fontpixelsize)

{
  uchar *puVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  uint uVar35;
  int *piVar36;
  long lVar37;
  ulong uVar38;
  void *pvVar39;
  void *pvVar40;
  void *pvVar41;
  int dx;
  long lVar42;
  byte bVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  byte bVar47;
  byte bVar48;
  void *pvVar49;
  byte *pbVar50;
  int dx_1;
  uint uVar51;
  int iVar52;
  int dx_2;
  uint uVar53;
  byte *pbVar54;
  uint uVar55;
  short *rows1p;
  ulong uVar56;
  byte bVar57;
  int iVar58;
  ulong uVar59;
  long lVar60;
  int iVar61;
  long lVar62;
  uint uVar63;
  float fVar64;
  float fVar65;
  double dVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined8 local_118;
  float fStack_f4;
  Mat local_c8;
  Mat local_78;
  
  uVar35 = fontpixelsize * 2;
  uVar59 = 0;
  uVar56 = 0xffffffffffffffff;
  if (-1 < fontpixelsize) {
    uVar56 = (long)(fontpixelsize * 6) << 2;
  }
  uVar38 = 0;
  if (0 < fontpixelsize) {
    uVar38 = (ulong)(uint)fontpixelsize;
  }
  pvVar39 = operator_new__(uVar56);
  lVar62 = (long)fontpixelsize;
  lVar37 = (long)(int)uVar35 * 4 + lVar62 * 4;
  for (; uVar38 != uVar59; uVar59 = uVar59 + 1) {
    dVar66 = ((double)(int)uVar59 + 0.5) * (20.0 / (double)fontpixelsize) + -0.5;
    fVar64 = (float)dVar66;
    fVar65 = floorf(fVar64);
    local_118._4_4_ = (float)((ulong)dVar66 >> 0x20);
    *(int *)((long)pvVar39 + uVar59 * 4) = (int)fVar65;
    fVar64 = (fVar64 - (float)(int)fVar65) * 2048.0;
    uVar63 = -(uint)(0.0 <= 2048.0 - fVar64);
    auVar67._0_4_ = (int)((float)(uVar63 & 0x3f000000 | ~uVar63 & 0xbf000000) + (2048.0 - fVar64));
    auVar67._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar64) & 0x3f000000 | ~-(uint)(0.0 <= fVar64) & 0xbf000000) +
              fVar64);
    auVar67._8_4_ = 0;
    auVar67._12_4_ = (int)(local_118._4_4_ + 0.0);
    auVar67 = packssdw(auVar67,auVar67);
    *(int *)((long)pvVar39 + uVar59 * 4 + lVar37) = auVar67._0_4_;
  }
  local_118 = (ushort *)((long)pvVar39 + lVar62 * 4 + lVar37);
  uVar59 = 0;
  uVar56 = 0;
  if (0 < (int)uVar35) {
    uVar56 = (ulong)uVar35;
  }
  for (; uVar56 != uVar59; uVar59 = uVar59 + 1) {
    dVar66 = ((double)(int)uVar59 + 0.5) * (20.0 / (double)fontpixelsize) + -0.5;
    fVar64 = (float)dVar66;
    fVar65 = floorf(fVar64);
    fStack_f4 = (float)((ulong)dVar66 >> 0x20);
    *(int *)((long)pvVar39 + uVar59 * 4 + lVar62 * 4) = (int)fVar65;
    fVar64 = (fVar64 - (float)(int)fVar65) * 2048.0;
    uVar63 = -(uint)(0.0 <= 2048.0 - fVar64);
    auVar72._0_4_ = (int)((float)(uVar63 & 0x3f000000 | ~uVar63 & 0xbf000000) + (2048.0 - fVar64));
    auVar72._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar64) & 0x3f000000 | ~-(uint)(0.0 <= fVar64) & 0xbf000000) +
              fVar64);
    auVar72._8_4_ = 0;
    auVar72._12_4_ = (int)(fStack_f4 + 0.0);
    auVar67 = packssdw(auVar72,auVar72);
    *(int *)(local_118 + uVar59 * 2) = auVar67._0_4_;
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,fontpixelsize,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,fontpixelsize,2,(Allocator *)0x0);
  for (uVar56 = 0; uVar38 != uVar56; uVar56 = uVar56 + 1) {
    *(undefined2 *)((long)local_78.data + uVar56 * 2) = 0;
  }
  lVar42 = lVar62 * 4 + (long)(int)uVar35 * 4;
  lVar37 = lVar42 + 2;
  pvVar40 = local_c8.data;
  pvVar49 = local_78.data;
  iVar52 = -2;
  iVar46 = 0;
  do {
    while( true ) {
      if ((int)uVar35 <= iVar46) {
        operator_delete__(pvVar39);
        piVar36 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar36 != (int *)0x0) {
          LOCK();
          *piVar36 = *piVar36 + -1;
          UNLOCK();
          if (*piVar36 == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              free(local_78.data);
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar36 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar36 != (int *)0x0) {
          LOCK();
          *piVar36 = *piVar36 + -1;
          UNLOCK();
          if (*piVar36 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        return;
      }
      iVar44 = *(int *)((long)pvVar39 + (long)iVar46 * 4 + lVar62 * 4);
      pvVar41 = pvVar40;
      if (iVar44 != iVar52) {
        iVar58 = iVar44 * 10;
        if (iVar44 == iVar52 + 1) {
          pvVar41 = pvVar49;
          pvVar49 = pvVar40;
          if (iVar44 < 0x27) {
            pbVar50 = font_bitmap + (iVar58 + 10);
            for (uVar56 = 0; uVar38 != uVar56; uVar56 = uVar56 + 1) {
              uVar63 = *(uint *)((long)pvVar39 + uVar56 * 4);
              if ((int)uVar63 < 0) {
                bVar43 = *pbVar50 & 0xf;
                bVar48 = 0;
              }
              else if (uVar63 < 0x13) {
                bVar43 = pbVar50[uVar63 >> 1];
                if ((uVar63 & 1) == 0) {
                  bVar48 = bVar43 & 0xf;
                  bVar43 = bVar43 >> 4;
                }
                else {
                  bVar48 = bVar43 >> 4;
                  bVar43 = pbVar50[(ulong)(uVar63 >> 1) + 1] & 0xf;
                }
              }
              else {
                bVar48 = pbVar50[9] >> 4;
                bVar43 = 0;
              }
              uVar63 = (uint)bVar43 * (int)*(short *)((long)pvVar39 + uVar56 * 4 + lVar37) +
                       (uint)bVar48 * (int)*(short *)((long)pvVar39 + uVar56 * 4 + lVar42);
              *(short *)((long)pvVar40 + uVar56 * 2) = (short)(uVar63 >> 4) + (short)uVar63;
            }
          }
          else {
            for (uVar56 = 0; uVar38 != uVar56; uVar56 = uVar56 + 1) {
              *(undefined2 *)((long)pvVar40 + uVar56 * 2) = 0;
            }
          }
        }
        else {
          pbVar50 = font_bitmap + iVar58;
          lVar60 = (long)iVar58 + 1;
          if (iVar44 < 0x27) {
            pbVar54 = font_bitmap + (iVar58 + 10);
            for (uVar56 = 0; uVar38 != uVar56; uVar56 = uVar56 + 1) {
              uVar63 = *(uint *)((long)pvVar39 + uVar56 * 4);
              if ((int)uVar63 < 0) {
                bVar43 = *pbVar50 & 0xf;
                bVar48 = *pbVar54 & 0xf;
                bVar47 = 0;
                bVar57 = 0;
              }
              else if (uVar63 < 0x13) {
                uVar59 = (ulong)(uVar63 >> 1);
                bVar43 = pbVar50[uVar59];
                if ((uVar63 & 1) == 0) {
                  bVar57 = bVar43 & 0xf;
                  bVar43 = bVar43 >> 4;
                  bVar47 = pbVar54[uVar59] & 0xf;
                  bVar48 = pbVar54[uVar59] >> 4;
                }
                else {
                  bVar57 = bVar43 >> 4;
                  bVar43 = font_bitmap[uVar59 + lVar60] & 0xf;
                  bVar47 = pbVar54[uVar59] >> 4;
                  bVar48 = pbVar54[uVar59 + 1] & 0xf;
                }
              }
              else {
                bVar57 = pbVar50[9] >> 4;
                bVar47 = pbVar54[9] >> 4;
                bVar48 = 0;
                bVar43 = 0;
              }
              iVar58 = (int)*(short *)((long)pvVar39 + uVar56 * 4 + lVar42);
              iVar52 = (int)*(short *)((long)pvVar39 + uVar56 * 4 + lVar37);
              uVar63 = (uint)bVar43 * iVar52 + (uint)bVar57 * iVar58;
              *(short *)((long)pvVar40 + uVar56 * 2) = (short)(uVar63 >> 4) + (short)uVar63;
              uVar63 = (uint)bVar48 * iVar52 + (uint)bVar47 * iVar58;
              *(short *)((long)pvVar49 + uVar56 * 2) = (short)(uVar63 >> 4) + (short)uVar63;
            }
          }
          else {
            for (uVar56 = 0; uVar38 != uVar56; uVar56 = uVar56 + 1) {
              uVar63 = *(uint *)((long)pvVar39 + uVar56 * 4);
              if ((int)uVar63 < 0) {
                bVar43 = *pbVar50 & 0xf;
                bVar48 = 0;
              }
              else if (uVar63 < 0x13) {
                bVar43 = pbVar50[uVar63 >> 1];
                if ((uVar63 & 1) == 0) {
                  bVar48 = bVar43 & 0xf;
                  bVar43 = bVar43 >> 4;
                }
                else {
                  bVar48 = bVar43 >> 4;
                  bVar43 = font_bitmap[(ulong)(uVar63 >> 1) + lVar60] & 0xf;
                }
              }
              else {
                bVar48 = pbVar50[9] >> 4;
                bVar43 = 0;
              }
              uVar63 = (uint)bVar43 * (int)*(short *)((long)pvVar39 + uVar56 * 4 + lVar37) +
                       (uint)bVar48 * (int)*(short *)((long)pvVar39 + uVar56 * 4 + lVar42);
              *(short *)((long)pvVar40 + uVar56 * 2) = (short)(uVar63 >> 4) + (short)uVar63;
              *(undefined2 *)((long)pvVar49 + uVar56 * 2) = 0;
            }
          }
        }
      }
      iVar58 = iVar46 + 1;
      pvVar40 = pvVar41;
      iVar52 = iVar44;
      if (iVar58 < (int)uVar35) break;
      uVar2 = *local_118;
LAB_00137573:
      uVar63 = (uint)(short)local_118[1];
      iVar46 = iVar46 * fontpixelsize;
      auVar67 = pshuflw(ZEXT216(uVar2),ZEXT216(uVar2),0);
      auVar79._0_4_ = auVar67._0_4_;
      auVar79._4_4_ = auVar79._0_4_;
      auVar79._8_4_ = auVar79._0_4_;
      auVar79._12_4_ = auVar79._0_4_;
      auVar67 = pshuflw(ZEXT416(uVar63),ZEXT416(uVar63),0);
      auVar81._0_4_ = auVar67._0_4_;
      auVar81._4_4_ = auVar81._0_4_;
      auVar81._8_4_ = auVar81._0_4_;
      auVar81._12_4_ = auVar81._0_4_;
      for (lVar60 = 0; (int)lVar60 + 0xf < fontpixelsize; lVar60 = lVar60 + 0x10) {
        auVar67 = pmulhw(*(undefined1 (*) [16])((long)pvVar41 + lVar60 * 2),auVar79);
        auVar71 = pmulhw(*(undefined1 (*) [16])((long)pvVar49 + lVar60 * 2),auVar81);
        auVar72 = pmulhw(*(undefined1 (*) [16])((long)pvVar41 + lVar60 * 2 + 0x10),auVar79);
        auVar73 = pmulhw(*(undefined1 (*) [16])((long)pvVar49 + lVar60 * 2 + 0x10),auVar81);
        auVar82._0_2_ = auVar71._0_2_ + auVar67._0_2_ + 2;
        auVar82._2_2_ = auVar71._2_2_ + auVar67._2_2_ + 2;
        auVar82._4_2_ = auVar71._4_2_ + auVar67._4_2_ + 2;
        auVar82._6_2_ = auVar71._6_2_ + auVar67._6_2_ + 2;
        auVar82._8_2_ = auVar71._8_2_ + auVar67._8_2_ + 2;
        auVar82._10_2_ = auVar71._10_2_ + auVar67._10_2_ + 2;
        auVar82._12_2_ = auVar71._12_2_ + auVar67._12_2_ + 2;
        auVar82._14_2_ = auVar71._14_2_ + auVar67._14_2_ + 2;
        auVar67 = psraw(auVar82,2);
        auVar74._0_2_ = auVar73._0_2_ + auVar72._0_2_ + 2;
        auVar74._2_2_ = auVar73._2_2_ + auVar72._2_2_ + 2;
        auVar74._4_2_ = auVar73._4_2_ + auVar72._4_2_ + 2;
        auVar74._6_2_ = auVar73._6_2_ + auVar72._6_2_ + 2;
        auVar74._8_2_ = auVar73._8_2_ + auVar72._8_2_ + 2;
        auVar74._10_2_ = auVar73._10_2_ + auVar72._10_2_ + 2;
        auVar74._12_2_ = auVar73._12_2_ + auVar72._12_2_ + 2;
        auVar74._14_2_ = auVar73._14_2_ + auVar72._14_2_ + 2;
        auVar72 = psraw(auVar74,2);
        sVar3 = auVar67._0_2_;
        sVar4 = auVar67._2_2_;
        sVar5 = auVar67._4_2_;
        sVar6 = auVar67._6_2_;
        sVar7 = auVar67._8_2_;
        sVar8 = auVar67._10_2_;
        sVar9 = auVar67._12_2_;
        sVar10 = auVar67._14_2_;
        sVar11 = auVar72._0_2_;
        sVar12 = auVar72._2_2_;
        sVar13 = auVar72._4_2_;
        sVar14 = auVar72._6_2_;
        sVar15 = auVar72._8_2_;
        sVar16 = auVar72._10_2_;
        sVar17 = auVar72._12_2_;
        sVar18 = auVar72._14_2_;
        puVar1 = resized_font_bitmap + lVar60 + iVar46;
        *puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar67[0] - (0xff < sVar3);
        puVar1[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar67[2] - (0xff < sVar4);
        puVar1[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar67[4] - (0xff < sVar5);
        puVar1[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar67[6] - (0xff < sVar6);
        puVar1[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar67[8] - (0xff < sVar7);
        puVar1[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar67[10] - (0xff < sVar8);
        puVar1[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar67[0xc] - (0xff < sVar9);
        puVar1[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar67[0xe] - (0xff < sVar10);
        puVar1[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar72[0] - (0xff < sVar11);
        puVar1[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar72[2] - (0xff < sVar12);
        puVar1[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar72[4] - (0xff < sVar13);
        puVar1[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar72[6] - (0xff < sVar14);
        puVar1[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar72[8] - (0xff < sVar15);
        puVar1[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar72[10] - (0xff < sVar16);
        puVar1[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar72[0xc] - (0xff < sVar17);
        puVar1[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar72[0xe] - (0xff < sVar18);
      }
      for (; (int)lVar60 + 7 < fontpixelsize; lVar60 = lVar60 + 8) {
        auVar67 = pmulhw(*(undefined1 (*) [16])((long)pvVar41 + lVar60 * 2),auVar79);
        auVar72 = pmulhw(*(undefined1 (*) [16])((long)pvVar49 + lVar60 * 2),auVar81);
        auVar70._0_2_ = auVar72._0_2_ + auVar67._0_2_ + 2;
        auVar70._2_2_ = auVar72._2_2_ + auVar67._2_2_ + 2;
        auVar70._4_2_ = auVar72._4_2_ + auVar67._4_2_ + 2;
        auVar70._6_2_ = auVar72._6_2_ + auVar67._6_2_ + 2;
        auVar70._8_2_ = auVar72._8_2_ + auVar67._8_2_ + 2;
        auVar70._10_2_ = auVar72._10_2_ + auVar67._10_2_ + 2;
        auVar70._12_2_ = auVar72._12_2_ + auVar67._12_2_ + 2;
        auVar70._14_2_ = auVar72._14_2_ + auVar67._14_2_ + 2;
        auVar67 = psraw(auVar70,2);
        sVar3 = auVar67._0_2_;
        sVar4 = auVar67._2_2_;
        sVar5 = auVar67._4_2_;
        sVar6 = auVar67._6_2_;
        sVar7 = auVar67._8_2_;
        sVar8 = auVar67._10_2_;
        sVar9 = auVar67._12_2_;
        sVar10 = auVar67._14_2_;
        *(ulong *)(resized_font_bitmap + lVar60 + iVar46) =
             CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar67[0xe] - (0xff < sVar10),
                      CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar67[0xc] - (0xff < sVar9),
                               CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar67[10] - (0xff < sVar8)
                                        ,CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar67[8] -
                                                  (0xff < sVar7),
                                                  CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                           auVar67[6] - (0xff < sVar6),
                                                           CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                    auVar67[4] - (0xff < sVar5),
                                                                    CONCAT11((0 < sVar4) *
                                                                             (sVar4 < 0x100) *
                                                                             auVar67[2] -
                                                                             (0xff < sVar4),
                                                                             (0 < sVar3) *
                                                                             (sVar3 < 0x100) *
                                                                             auVar67[0] -
                                                                             (0xff < sVar3))))))));
      }
      for (; (int)lVar60 < fontpixelsize; lVar60 = lVar60 + 1) {
        resized_font_bitmap[lVar60 + iVar46] =
             (uchar)(((uint)((int)*(short *)((long)pvVar41 + lVar60 * 2) * (int)(short)uVar2) >>
                     0x10) + ((int)*(short *)((long)pvVar49 + lVar60 * 2) * uVar63 >> 0x10) + 2 >> 2
                    );
      }
      local_118 = local_118 + 2;
      iVar46 = iVar58;
    }
    uVar2 = *local_118;
    if (*(int *)((long)pvVar39 + (long)iVar58 * 4 + lVar62 * 4) != iVar44) goto LAB_00137573;
    uVar63 = (uint)(short)uVar2;
    uVar51 = (uint)(short)local_118[1];
    uVar53 = (uint)(short)local_118[2];
    uVar55 = (uint)(short)local_118[3];
    iVar44 = iVar46 * fontpixelsize;
    iVar58 = iVar58 * fontpixelsize;
    auVar67 = pshuflw(ZEXT416(uVar63),ZEXT416(uVar63),0);
    auVar71._0_4_ = auVar67._0_4_;
    auVar71._4_4_ = auVar71._0_4_;
    auVar71._8_4_ = auVar71._0_4_;
    auVar71._12_4_ = auVar71._0_4_;
    auVar67 = pshuflw(ZEXT416(uVar51),ZEXT416(uVar51),0);
    auVar73._0_4_ = auVar67._0_4_;
    auVar73._4_4_ = auVar73._0_4_;
    auVar73._8_4_ = auVar73._0_4_;
    auVar73._12_4_ = auVar73._0_4_;
    auVar67 = pshuflw(ZEXT416(uVar53),ZEXT416(uVar53),0);
    auVar68._0_4_ = auVar67._0_4_;
    auVar68._4_4_ = auVar68._0_4_;
    auVar68._8_4_ = auVar68._0_4_;
    auVar68._12_4_ = auVar68._0_4_;
    auVar67 = pshuflw(ZEXT416(uVar55),ZEXT416(uVar55),0);
    auVar69._0_4_ = auVar67._0_4_;
    auVar69._4_4_ = auVar69._0_4_;
    auVar69._8_4_ = auVar69._0_4_;
    auVar69._12_4_ = auVar69._0_4_;
    for (lVar60 = 0; (int)lVar60 + 0xf < fontpixelsize; lVar60 = lVar60 + 0x10) {
      auVar67 = *(undefined1 (*) [16])((long)pvVar41 + lVar60 * 2);
      auVar72 = *(undefined1 (*) [16])((long)pvVar41 + lVar60 * 2 + 0x10);
      auVar76 = *(undefined1 (*) [16])((long)pvVar49 + lVar60 * 2);
      auVar78 = *(undefined1 (*) [16])((long)pvVar49 + lVar60 * 2 + 0x10);
      auVar80 = pmulhw(auVar67,auVar71);
      auVar75 = pmulhw(auVar76,auVar73);
      auVar81 = pmulhw(auVar72,auVar71);
      auVar82 = pmulhw(auVar78,auVar73);
      auVar77 = pmulhw(auVar67,auVar68);
      auVar67 = pmulhw(auVar76,auVar69);
      auVar79 = pmulhw(auVar72,auVar68);
      auVar72 = pmulhw(auVar78,auVar69);
      auVar83._0_2_ = auVar75._0_2_ + auVar80._0_2_ + 2;
      auVar83._2_2_ = auVar75._2_2_ + auVar80._2_2_ + 2;
      auVar83._4_2_ = auVar75._4_2_ + auVar80._4_2_ + 2;
      auVar83._6_2_ = auVar75._6_2_ + auVar80._6_2_ + 2;
      auVar83._8_2_ = auVar75._8_2_ + auVar80._8_2_ + 2;
      auVar83._10_2_ = auVar75._10_2_ + auVar80._10_2_ + 2;
      auVar83._12_2_ = auVar75._12_2_ + auVar80._12_2_ + 2;
      auVar83._14_2_ = auVar75._14_2_ + auVar80._14_2_ + 2;
      auVar75 = psraw(auVar83,2);
      auVar80._0_2_ = auVar82._0_2_ + auVar81._0_2_ + 2;
      auVar80._2_2_ = auVar82._2_2_ + auVar81._2_2_ + 2;
      auVar80._4_2_ = auVar82._4_2_ + auVar81._4_2_ + 2;
      auVar80._6_2_ = auVar82._6_2_ + auVar81._6_2_ + 2;
      auVar80._8_2_ = auVar82._8_2_ + auVar81._8_2_ + 2;
      auVar80._10_2_ = auVar82._10_2_ + auVar81._10_2_ + 2;
      auVar80._12_2_ = auVar82._12_2_ + auVar81._12_2_ + 2;
      auVar80._14_2_ = auVar82._14_2_ + auVar81._14_2_ + 2;
      auVar83 = psraw(auVar80,2);
      sVar3 = auVar75._0_2_;
      sVar5 = auVar75._2_2_;
      sVar7 = auVar75._4_2_;
      sVar9 = auVar75._6_2_;
      sVar11 = auVar75._8_2_;
      sVar13 = auVar75._10_2_;
      sVar15 = auVar75._12_2_;
      sVar17 = auVar75._14_2_;
      sVar19 = auVar83._0_2_;
      sVar21 = auVar83._2_2_;
      sVar23 = auVar83._4_2_;
      sVar25 = auVar83._6_2_;
      sVar27 = auVar83._8_2_;
      sVar29 = auVar83._10_2_;
      sVar31 = auVar83._12_2_;
      sVar33 = auVar83._14_2_;
      auVar76._0_2_ = auVar67._0_2_ + auVar77._0_2_ + 2;
      auVar76._2_2_ = auVar67._2_2_ + auVar77._2_2_ + 2;
      auVar76._4_2_ = auVar67._4_2_ + auVar77._4_2_ + 2;
      auVar76._6_2_ = auVar67._6_2_ + auVar77._6_2_ + 2;
      auVar76._8_2_ = auVar67._8_2_ + auVar77._8_2_ + 2;
      auVar76._10_2_ = auVar67._10_2_ + auVar77._10_2_ + 2;
      auVar76._12_2_ = auVar67._12_2_ + auVar77._12_2_ + 2;
      auVar76._14_2_ = auVar67._14_2_ + auVar77._14_2_ + 2;
      auVar67 = psraw(auVar76,2);
      auVar78._0_2_ = auVar72._0_2_ + auVar79._0_2_ + 2;
      auVar78._2_2_ = auVar72._2_2_ + auVar79._2_2_ + 2;
      auVar78._4_2_ = auVar72._4_2_ + auVar79._4_2_ + 2;
      auVar78._6_2_ = auVar72._6_2_ + auVar79._6_2_ + 2;
      auVar78._8_2_ = auVar72._8_2_ + auVar79._8_2_ + 2;
      auVar78._10_2_ = auVar72._10_2_ + auVar79._10_2_ + 2;
      auVar78._12_2_ = auVar72._12_2_ + auVar79._12_2_ + 2;
      auVar78._14_2_ = auVar72._14_2_ + auVar79._14_2_ + 2;
      auVar72 = psraw(auVar78,2);
      sVar4 = auVar67._0_2_;
      sVar6 = auVar67._2_2_;
      sVar8 = auVar67._4_2_;
      sVar10 = auVar67._6_2_;
      sVar12 = auVar67._8_2_;
      sVar14 = auVar67._10_2_;
      sVar16 = auVar67._12_2_;
      sVar18 = auVar67._14_2_;
      sVar20 = auVar72._0_2_;
      sVar22 = auVar72._2_2_;
      sVar24 = auVar72._4_2_;
      sVar26 = auVar72._6_2_;
      sVar28 = auVar72._8_2_;
      sVar30 = auVar72._10_2_;
      sVar32 = auVar72._12_2_;
      sVar34 = auVar72._14_2_;
      puVar1 = resized_font_bitmap + lVar60 + iVar44;
      *puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar75[0] - (0xff < sVar3);
      puVar1[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar75[2] - (0xff < sVar5);
      puVar1[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar75[4] - (0xff < sVar7);
      puVar1[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar75[6] - (0xff < sVar9);
      puVar1[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar75[8] - (0xff < sVar11);
      puVar1[5] = (0 < sVar13) * (sVar13 < 0x100) * auVar75[10] - (0xff < sVar13);
      puVar1[6] = (0 < sVar15) * (sVar15 < 0x100) * auVar75[0xc] - (0xff < sVar15);
      puVar1[7] = (0 < sVar17) * (sVar17 < 0x100) * auVar75[0xe] - (0xff < sVar17);
      puVar1[8] = (0 < sVar19) * (sVar19 < 0x100) * auVar83[0] - (0xff < sVar19);
      puVar1[9] = (0 < sVar21) * (sVar21 < 0x100) * auVar83[2] - (0xff < sVar21);
      puVar1[10] = (0 < sVar23) * (sVar23 < 0x100) * auVar83[4] - (0xff < sVar23);
      puVar1[0xb] = (0 < sVar25) * (sVar25 < 0x100) * auVar83[6] - (0xff < sVar25);
      puVar1[0xc] = (0 < sVar27) * (sVar27 < 0x100) * auVar83[8] - (0xff < sVar27);
      puVar1[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar83[10] - (0xff < sVar29);
      puVar1[0xe] = (0 < sVar31) * (sVar31 < 0x100) * auVar83[0xc] - (0xff < sVar31);
      puVar1[0xf] = (0 < sVar33) * (sVar33 < 0x100) * auVar83[0xe] - (0xff < sVar33);
      puVar1 = resized_font_bitmap + lVar60 + iVar58;
      *puVar1 = (0 < sVar4) * (sVar4 < 0x100) * auVar67[0] - (0xff < sVar4);
      puVar1[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar67[2] - (0xff < sVar6);
      puVar1[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar67[4] - (0xff < sVar8);
      puVar1[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar67[6] - (0xff < sVar10);
      puVar1[4] = (0 < sVar12) * (sVar12 < 0x100) * auVar67[8] - (0xff < sVar12);
      puVar1[5] = (0 < sVar14) * (sVar14 < 0x100) * auVar67[10] - (0xff < sVar14);
      puVar1[6] = (0 < sVar16) * (sVar16 < 0x100) * auVar67[0xc] - (0xff < sVar16);
      puVar1[7] = (0 < sVar18) * (sVar18 < 0x100) * auVar67[0xe] - (0xff < sVar18);
      puVar1[8] = (0 < sVar20) * (sVar20 < 0x100) * auVar72[0] - (0xff < sVar20);
      puVar1[9] = (0 < sVar22) * (sVar22 < 0x100) * auVar72[2] - (0xff < sVar22);
      puVar1[10] = (0 < sVar24) * (sVar24 < 0x100) * auVar72[4] - (0xff < sVar24);
      puVar1[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar72[6] - (0xff < sVar26);
      puVar1[0xc] = (0 < sVar28) * (sVar28 < 0x100) * auVar72[8] - (0xff < sVar28);
      puVar1[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar72[10] - (0xff < sVar30);
      puVar1[0xe] = (0 < sVar32) * (sVar32 < 0x100) * auVar72[0xc] - (0xff < sVar32);
      puVar1[0xf] = (0 < sVar34) * (sVar34 < 0x100) * auVar72[0xe] - (0xff < sVar34);
    }
    for (; (int)lVar60 + 7 < fontpixelsize; lVar60 = lVar60 + 8) {
      auVar67 = *(undefined1 (*) [16])((long)pvVar41 + lVar60 * 2);
      auVar72 = *(undefined1 (*) [16])((long)pvVar49 + lVar60 * 2);
      auVar76 = pmulhw(auVar67,auVar71);
      auVar78 = pmulhw(auVar72,auVar73);
      auVar67 = pmulhw(auVar67,auVar68);
      auVar72 = pmulhw(auVar72,auVar69);
      auVar77._0_2_ = auVar78._0_2_ + auVar76._0_2_ + 2;
      auVar77._2_2_ = auVar78._2_2_ + auVar76._2_2_ + 2;
      auVar77._4_2_ = auVar78._4_2_ + auVar76._4_2_ + 2;
      auVar77._6_2_ = auVar78._6_2_ + auVar76._6_2_ + 2;
      auVar77._8_2_ = auVar78._8_2_ + auVar76._8_2_ + 2;
      auVar77._10_2_ = auVar78._10_2_ + auVar76._10_2_ + 2;
      auVar77._12_2_ = auVar78._12_2_ + auVar76._12_2_ + 2;
      auVar77._14_2_ = auVar78._14_2_ + auVar76._14_2_ + 2;
      auVar76 = psraw(auVar77,2);
      sVar3 = auVar76._0_2_;
      sVar5 = auVar76._2_2_;
      sVar7 = auVar76._4_2_;
      sVar9 = auVar76._6_2_;
      sVar11 = auVar76._8_2_;
      sVar13 = auVar76._10_2_;
      sVar15 = auVar76._12_2_;
      sVar17 = auVar76._14_2_;
      auVar75._0_2_ = auVar72._0_2_ + auVar67._0_2_ + 2;
      auVar75._2_2_ = auVar72._2_2_ + auVar67._2_2_ + 2;
      auVar75._4_2_ = auVar72._4_2_ + auVar67._4_2_ + 2;
      auVar75._6_2_ = auVar72._6_2_ + auVar67._6_2_ + 2;
      auVar75._8_2_ = auVar72._8_2_ + auVar67._8_2_ + 2;
      auVar75._10_2_ = auVar72._10_2_ + auVar67._10_2_ + 2;
      auVar75._12_2_ = auVar72._12_2_ + auVar67._12_2_ + 2;
      auVar75._14_2_ = auVar72._14_2_ + auVar67._14_2_ + 2;
      auVar67 = psraw(auVar75,2);
      sVar4 = auVar67._0_2_;
      sVar6 = auVar67._2_2_;
      sVar8 = auVar67._4_2_;
      sVar10 = auVar67._6_2_;
      sVar12 = auVar67._8_2_;
      sVar14 = auVar67._10_2_;
      sVar16 = auVar67._12_2_;
      sVar18 = auVar67._14_2_;
      *(ulong *)(resized_font_bitmap + lVar60 + iVar44) =
           CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar76[0xe] - (0xff < sVar17),
                    CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar76[0xc] - (0xff < sVar15),
                             CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar76[10] -
                                      (0xff < sVar13),
                                      CONCAT14((0 < sVar11) * (sVar11 < 0x100) * auVar76[8] -
                                               (0xff < sVar11),
                                               CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar76[6] -
                                                        (0xff < sVar9),
                                                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                 auVar76[4] - (0xff < sVar7),
                                                                 CONCAT11((0 < sVar5) *
                                                                          (sVar5 < 0x100) *
                                                                          auVar76[2] -
                                                                          (0xff < sVar5),
                                                                          (0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar76[0] -
                                                                          (0xff < sVar3))))))));
      *(ulong *)(resized_font_bitmap + lVar60 + iVar58) =
           CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar67[0xe] - (0xff < sVar18),
                    CONCAT16((0 < sVar16) * (sVar16 < 0x100) * auVar67[0xc] - (0xff < sVar16),
                             CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar67[10] -
                                      (0xff < sVar14),
                                      CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar67[8] -
                                               (0xff < sVar12),
                                               CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar67[6]
                                                        - (0xff < sVar10),
                                                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                                 auVar67[4] - (0xff < sVar8),
                                                                 CONCAT11((0 < sVar6) *
                                                                          (sVar6 < 0x100) *
                                                                          auVar67[2] -
                                                                          (0xff < sVar6),
                                                                          (0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar67[0] -
                                                                          (0xff < sVar4))))))));
    }
    for (; (int)lVar60 < fontpixelsize; lVar60 = lVar60 + 1) {
      iVar45 = (int)*(short *)((long)pvVar41 + lVar60 * 2);
      iVar61 = (int)*(short *)((long)pvVar49 + lVar60 * 2);
      resized_font_bitmap[lVar60 + iVar44] =
           (uchar)((iVar61 * uVar51 >> 0x10) + (iVar45 * uVar63 >> 0x10) + 2 >> 2);
      resized_font_bitmap[lVar60 + iVar58] =
           (uchar)((iVar45 * uVar53 >> 0x10) + (iVar61 * uVar55 >> 0x10) + 2 >> 2);
    }
    local_118 = local_118 + 4;
    iVar46 = iVar46 + 2;
  } while( true );
}

Assistant:

void resize_bilinear_font(const unsigned char* font_bitmap, unsigned char* resized_font_bitmap, int fontpixelsize)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    const int srcw = 20;
    const int srch = 40;
    const int w = fontpixelsize;
    const int h = fontpixelsize * 2;

    double scale = (double)srcw / w;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        xofs[dx] = sx;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w, (size_t)2u);
    Mat rowsbuf1(w, (size_t)2u);
    short* rows0 = (short*)rowsbuf0;
    short* rows1 = (short*)rowsbuf1;

    {
        short* rows1p = rows1;
        for (int dx = 0; dx < w; dx++)
        {
            rows1p[dx] = 0;
        }
    }

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    rows1p[dx] = 0;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = font_bitmap + 10 * (sy);
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = 0;

                    ialphap += 2;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;
                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            short b0 = ibeta[0];
            short b1 = ibeta[1];
            short b2 = ibeta[2];
            short b3 = ibeta[3];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp0 = resized_font_bitmap + w * (dy);
            unsigned char* Dp1 = resized_font_bitmap + w * (dy + 1);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            int16x8_t _b2 = vdupq_n_s16(b2);
            int16x8_t _b3 = vdupq_n_s16(b3);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc00 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc01 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                int16x8_t _acc10 = vaddq_s16(vqdmulhq_s16(_r00, _b2), vqdmulhq_s16(_r10, _b3));
                int16x8_t _acc11 = vaddq_s16(vqdmulhq_s16(_r01, _b2), vqdmulhq_s16(_r11, _b3));
                uint8x16_t _Dp0 = vcombine_u8(vqrshrun_n_s16(_acc00, 3), vqrshrun_n_s16(_acc01, 3));
                uint8x16_t _Dp1 = vcombine_u8(vqrshrun_n_s16(_acc10, 3), vqrshrun_n_s16(_acc11, 3));
                vst1q_u8(Dp0, _Dp0);
                vst1q_u8(Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r0, _b2), vqdmulhq_s16(_r1, _b3));
                uint8x8_t _Dp0 = vqrshrun_n_s16(_acc0, 3);
                uint8x8_t _Dp1 = vqrshrun_n_s16(_acc1, 3);
                vst1_u8(Dp0, _Dp0);
                vst1_u8(Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _b2 = _mm_set1_epi16(b2);
            __m128i _b3 = _mm_set1_epi16(b3);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc00 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc01 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                __m128i _acc10 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b2), _mm_mulhi_epi16(_r10, _b3));
                __m128i _acc11 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b2), _mm_mulhi_epi16(_r11, _b3));
                _acc00 = _mm_srai_epi16(_mm_add_epi16(_acc00, _v2), 2);
                _acc01 = _mm_srai_epi16(_mm_add_epi16(_acc01, _v2), 2);
                _acc10 = _mm_srai_epi16(_mm_add_epi16(_acc10, _v2), 2);
                _acc11 = _mm_srai_epi16(_mm_add_epi16(_acc11, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc00, _acc01);
                __m128i _Dp1 = _mm_packus_epi16(_acc10, _acc11);
                _mm_storeu_si128((__m128i*)Dp0, _Dp0);
                _mm_storeu_si128((__m128i*)Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b2), _mm_mulhi_epi16(_r1, _b3));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc0, _acc0);
                __m128i _Dp1 = _mm_packus_epi16(_acc1, _acc1);
                _mm_storel_epi64((__m128i*)Dp0, _Dp0);
                _mm_storel_epi64((__m128i*)Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp0++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
                *Dp1++ = (unsigned char)(((short)((b2 * s0) >> 16) + (short)((b3 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            short b0 = ibeta[0];
            short b1 = ibeta[1];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp = resized_font_bitmap + w * (dy);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                uint8x16_t _Dp = vcombine_u8(vqrshrun_n_s16(_acc0, 3), vqrshrun_n_s16(_acc1, 3));
                vst1q_u8(Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                uint8x8_t _Dp = vqrshrun_n_s16(_acc, 3);
                vst1_u8(Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc0, _acc1);
                _mm_storeu_si128((__m128i*)Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                _acc = _mm_srai_epi16(_mm_add_epi16(_acc, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc, _acc);
                _mm_storel_epi64((__m128i*)Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 2;
        }
    }

    delete[] buf;
}